

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

int __thiscall
CVmObjHTTPRequest::getp_sendReplyChunk
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  TadsHttpServerThread *this_00;
  int iVar1;
  vm_httpreq_ext *pvVar2;
  bodyArg *this_01;
  undefined8 *puVar3;
  long *plVar4;
  ssize_t sVar5;
  int *in_RCX;
  size_t __n;
  vm_val_t *in_RDX;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar6;
  bodyArg *in_RDI;
  int in_R8D;
  http_reply_err err;
  char lbuf [20];
  err_frame_t err_cur__;
  bodyArg *body;
  TadsServerThread *t;
  TadsHttpRequest *req;
  uint argc;
  CVmNativeCodeDesc *in_stack_fffffffffffffe68;
  int sock_err;
  bodyArg *in_stack_fffffffffffffe70;
  undefined8 uVar7;
  vm_val_t *in_stack_fffffffffffffe78;
  int n;
  int argn;
  undefined1 local_168 [16];
  char local_158 [32];
  uint local_138 [2];
  undefined8 local_130;
  void *local_128;
  
  if (in_RCX == (int *)0x0) {
    n = 0;
  }
  else {
    n = *in_RCX;
  }
  argn = n;
  if ((getp_sendReplyChunk(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_sendReplyChunk(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_sendReplyChunk::desc,1);
    __cxa_guard_release(&getp_sendReplyChunk(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_fffffffffffffe78,(uint *)in_stack_fffffffffffffe70,
                     in_stack_fffffffffffffe68);
  sock_err = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  if (iVar1 == 0) {
    pvVar2 = get_ext((CVmObjHTTPRequest *)in_RDI);
    this_00 = pvVar2->req->thread;
    if ((pvVar2->req->super_TadsEventMessage).super_TadsMessage.completed != 0) {
      throw_net_err((char *)in_stack_fffffffffffffe70,sock_err);
    }
    this_01 = (bodyArg *)operator_new(0x58);
    bodyArg::bodyArg(in_RDI,argn);
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    local_130 = *puVar3;
    plVar4 = (long *)_ZTW11G_err_frame();
    *plVar4 = (long)local_138;
    local_138[0] = _setjmp((__jmp_buf_tag *)&stack0xfffffffffffffee0);
    if (local_138[0] == 0) {
      if (this_01->init_err != 0) {
        err_throw(0);
      }
      __n = (size_t)this_01->len;
      t3sprintf(local_158,0x14,"%lx\r\n");
      sVar5 = TadsServerThread::send
                        (&this_00->super_TadsServerThread,(int)local_158,__buf,__n,in_R8D);
      if ((int)sVar5 == 0) {
        TadsServerThread::last_error((TadsServerThread *)0x256313);
        throw_net_err((char *)in_stack_fffffffffffffe70,sock_err);
      }
      sVar5 = bodyArg::send(this_01,(int)this_00,local_168,__n,in_R8D);
      pvVar6 = extraout_RDX;
      if ((int)sVar5 == 0) {
        throw_net_err((char *)in_stack_fffffffffffffe70,sock_err);
        pvVar6 = extraout_RDX_00;
      }
      sVar5 = TadsServerThread::send(&this_00->super_TadsServerThread,0x3a9435,pvVar6,__n,in_R8D);
      if ((int)sVar5 == 0) {
        TadsServerThread::last_error((TadsServerThread *)0x256374);
        throw_net_err((char *)in_stack_fffffffffffffe70,sock_err);
      }
    }
    if (((local_138[0] & 0x8000) == 0) &&
       (local_138[0] = local_138[0] | 0x8000, this_01 != (bodyArg *)0x0)) {
      bodyArg::~bodyArg(in_stack_fffffffffffffe70);
      operator_delete(this_01,0x58);
    }
    uVar7 = local_130;
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    *puVar3 = uVar7;
    if ((local_138[0] & 0x4001) != 0) {
      puVar3 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(uint *)*puVar3 & 2) != 0) {
        plVar4 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar4 + 0x10));
      }
      pvVar6 = local_128;
      plVar4 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar4 + 0x10) = pvVar6;
      err_rethrow();
    }
    if ((local_138[0] & 2) != 0) {
      free(local_128);
    }
    CVmStack::discard(n);
    vm_val_t::set_nil(in_RDX);
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_sendReplyChunk(VMG_ vm_obj_id_t self,
                                           vm_val_t *retval, uint *oargc)
{
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the request and thread */
    TadsHttpRequest *req = get_ext()->req;
    TadsServerThread *t = req->thread;

    /* if the request is already completed, this is an error */
    if (req->completed)
        throw_net_err(vmg_ "request already completed", 0);

    /* retrieve the 'body' argument */
    bodyArg *body = new bodyArg(vmg_ 0);

    err_try
    {
        /* make sure we initialized the body correctly */
        if (body->init_err != 0)
            err_throw(body->init_err);
        
        /* send the length prefix */
        char lbuf[20];
        t3sprintf(lbuf, sizeof(lbuf), "%lx\r\n", (long)body->len);
        if (!t->send(lbuf))
            throw_net_err(vmg_ "error sending length prefix", t->last_error());

        /* send the body */
        http_reply_err err;
        if (!body->send(t, &err))
            throw_net_err(vmg_ err.msg, err.sock_err);

        /* send the CR-LF suffix */
        if (!t->send("\r\n"))
            throw_net_err(vmg_ "error sending suffix", t->last_error());
    }